

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O0

int gulpum(monst *mdef,attack *mattk)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  obj *obj;
  char *pcVar4;
  char local_138 [8];
  char kbuf [256];
  obj *local_30;
  obj *otmp;
  int dam;
  int tmp;
  attack *mattk_local;
  monst *mdef_local;
  
  otmp._0_4_ = dice((uint)mattk->damn,(uint)mattk->damd);
  if (3 < mdef->data->msize) {
    pcVar3 = Monnam(mdef);
    pline("%s is too large to be engulfed.",pcVar3);
    return 0;
  }
  if ((u.uhunger < 0x5dc) && ((u._1052_1_ & 1) == 0)) {
    for (local_30 = mdef->minvent; local_30 != (obj *)0x0; local_30 = local_30->nobj) {
      snuff_lit(local_30);
    }
    if ((((mdef->data == mons + 0xc) || (mdef->data == mons + 0xb)) && (u.uprops[8].extrinsic == 0))
       && ((youmonst.mintrinsics & 0x80) == 0)) {
      pcVar3 = mon_nam(mdef);
      pline("You bite into %s.",pcVar3);
      pcVar3 = mons_mname(mdef->data);
      pcVar3 = an(pcVar3);
      sprintf(local_138,"swallowing %s whole",pcVar3);
      delayed_petrify((char *)0x0,local_138);
    }
    else if ((mdef->data == mons + 0xdb) &&
            (((((u.uprops[4].intrinsic == 0 && (u.uprops[4].extrinsic == 0)) &&
               ((youmonst.mintrinsics & 8) == 0)) ||
              ((((u.uprops[4].intrinsic & 0x4000000) != 0 &&
                ((u.uprops[4].intrinsic & 0xfbffffff) == 0)) &&
               ((u.uprops[4].extrinsic == 0 && ((youmonst.mintrinsics & 8) == 0)))))) &&
             (((((u.uprops[4].intrinsic & 0x4000000) == 0 ||
                ((u.uprops[4].intrinsic & 0xfbffffff) != 0)) || (u.uprops[4].extrinsic != 0)) ||
              (((youmonst.mintrinsics & 8) != 0 || (iVar2 = rn2(10), iVar2 == 0)))))))) {
      pcVar3 = mon_nam(mdef);
      pline("You bite into %s.",pcVar3);
      pcVar3 = mons_mname(mdef->data);
      pcVar3 = an(pcVar3);
      sprintf(local_138,"swallowing %s whole",pcVar3);
      instadisintegrate(local_138);
    }
    else {
      start_engulf(mdef);
      switch(mattk->adtyp) {
      case '\0':
        if (youmonst.data == mons + 0x6e) {
          pcVar3 = Monnam(mdef);
          pline("%s is laden with your moisture.",pcVar3);
          if (((((mdef->data->mflags1 & 0x600) != 0) && (mdef->data != mons + 0x73)) &&
              (mdef->data != mons + 0x20)) &&
             ((mdef->data != mons + 0xa0 && (mdef->data != mons + 0x157)))) {
            otmp._0_4_ = 0;
            pcVar3 = Monnam(mdef);
            pline("%s seems unharmed.",pcVar3);
          }
        }
        else {
          pcVar3 = Monnam(mdef);
          pline("%s is pummeled with your debris!",pcVar3);
        }
        break;
      case '\x02':
        iVar2 = rn2(2);
        if (iVar2 == 0) {
          otmp._0_4_ = 0;
        }
        else {
          if ((mdef->mintrinsics & 1) == 0) {
            pcVar3 = Monnam(mdef);
            pline("%s is burning to a crisp!",pcVar3);
          }
          else {
            pcVar3 = Monnam(mdef);
            pline("%s seems mildly hot.",pcVar3);
            otmp._0_4_ = 0;
          }
          golemeffects(mdef,(uint)mattk->adtyp,(int)otmp);
        }
        break;
      case '\x03':
        iVar2 = rn2(2);
        if (iVar2 == 0) {
          otmp._0_4_ = 0;
        }
        else {
          if ((mdef->mintrinsics & 2) == 0) {
            pcVar3 = Monnam(mdef);
            pline("%s is freezing to death!",pcVar3);
          }
          else {
            pcVar3 = Monnam(mdef);
            pline("%s seems mildly chilly.",pcVar3);
            otmp._0_4_ = 0;
          }
          golemeffects(mdef,(uint)mattk->adtyp,(int)otmp);
        }
        break;
      case '\x06':
        iVar2 = rn2(2);
        if (iVar2 == 0) {
          otmp._0_4_ = 0;
        }
        else {
          pcVar3 = mon_nam(mdef);
          pline("The air around %s crackles with electricity.",pcVar3);
          if ((mdef->mintrinsics & 0x10) != 0) {
            pcVar3 = Monnam(mdef);
            pline("%s seems unhurt.",pcVar3);
            otmp._0_4_ = 0;
          }
          golemeffects(mdef,(uint)mattk->adtyp,(int)otmp);
        }
        break;
      case '\b':
        pcVar3 = Monnam(mdef);
        pline("%s is covered with your goo!",pcVar3);
        if ((mdef->mintrinsics & 0x40) != 0) {
          pcVar3 = mon_nam(mdef);
          pline("It seems harmless to %s.",pcVar3);
          otmp._0_4_ = 0;
        }
        break;
      case '\v':
        bVar1 = can_blnd(&youmonst,mdef,mattk->aatyp,(obj *)0x0);
        if (bVar1 != '\0') {
          if ((*(uint *)&mdef->field_0x60 >> 0x11 & 1) != 0) {
            pcVar3 = Monnam(mdef);
            pline("%s can\'t see in there!",pcVar3);
          }
          *(uint *)&mdef->field_0x60 = *(uint *)&mdef->field_0x60 & 0xfffdffff;
          otmp._0_4_ = (uint)mdef->mblinded + (int)otmp;
          if (0x7f < (int)otmp) {
            otmp._0_4_ = 0x7f;
          }
          mdef->mblinded = (uchar)(int)otmp;
        }
        otmp._0_4_ = 0;
        break;
      case '\x1a':
        if (((mdef->data == mons + 0x144) || (mdef->data == mons + 0x146)) ||
           (mdef->data == mons + 0x145)) {
          pline("Unfortunately, digesting any of it is fatal.");
          end_engulf(mdef);
          pcVar3 = mons_mname(mdef->data);
          sprintf(gulpum::msgbuf,"unwisely tried to eat %s",pcVar3);
          killer = gulpum::msgbuf;
          killer_format = 2;
          done(0);
          return 0;
        }
        if ((u.uprops[0x3f].intrinsic == 0) && (u.uprops[0x3f].extrinsic == 0)) {
          if ((((mdef->data->mlet == '\x02') ||
               (((((mdef->data->mlet == '\n' || (mdef->data->mlet == ' ')) ||
                  (mdef->data->mlet == '\x16')) || (mdef->data->mlet == '\x19')) ||
                ((mdef->data->mlet == '\x1f' && (mdef->data != mons + 0x9e)))))) ||
              ((mdef->data->mlet == '7' &&
               ((mdef->data != mons + 0x106 && (mdef->data != mons + 0x104)))))) ||
             ((mdef->data->mlet == '6' || ((mdef->data->mlet == '*' && (mdef->data != mons + 0xd6)))
              ))) {
            if (((mdef->data->mlet == '\x02') ||
                (((mdef->data->mlet == '\n' || (mdef->data->mlet == ' ')) ||
                 (mdef->data->mlet == '\x16')))) ||
               ((((mdef->data->mlet == '\x19' ||
                  ((mdef->data->mlet == '\x1f' && (mdef->data != mons + 0x9e)))) ||
                 ((mdef->data->mlet == '7' &&
                  ((mdef->data != mons + 0x106 && (mdef->data != mons + 0x104)))))) ||
                (mdef->data->mlet == '6')))) {
              violated(5);
            }
            else {
              violated(6);
            }
          }
          else {
            violated(7);
          }
          obj = mlifesaver(mdef);
          if (obj != (obj *)0x0) {
            m_useup(mdef,obj);
          }
          newuhs('\0');
          xkilled(mdef,2);
          if (mdef->mhp < 1) {
            otmp._4_4_ = ((int)(uint)mdef->data->cwt >> 8) + 1;
            bVar1 = corpse_chance(mdef,&youmonst,'\x01');
            if ((bVar1 == '\0') ||
               (iVar2 = monsndx(mdef->data), (mvitals[iVar2].mvflags & 0x10) != 0)) {
              otmp._4_4_ = 0;
            }
            else {
              u.uhunger = (mdef->data->cnutrit + 1) / 2 + u.uhunger;
            }
            pcVar3 = mon_nam(mdef);
            sprintf(gulpum::msgbuf,"You totally digest %s.",pcVar3);
            if (otmp._4_4_ == 0) {
              pline("%s",gulpum::msgbuf);
            }
            else {
              pcVar3 = mon_nam(mdef);
              pline("You digest %s.",pcVar3);
              if ((u.uprops[0x3f].intrinsic != 0) || (u.uprops[0x3f].extrinsic != 0)) {
                otmp._4_4_ = otmp._4_4_ << 1;
              }
              nomul(-otmp._4_4_,"digesting something");
              nomovemsg = gulpum::msgbuf;
            }
            if (mdef->data == mons + 0xd7) {
              pcVar3 = mons_mname(mdef->data);
              pcVar3 = The(pcVar3);
              sprintf(gulpum::msgbuf,"%s isn\'t sitting well with you.",pcVar3);
              if ((u.uprops[0x3d].intrinsic == 0) && (u.uprops[0x3d].extrinsic == 0)) {
                u.uprops[0x3a].intrinsic = 5;
                iflags.botl = '\x01';
              }
            }
            else {
              exercise(4,'\x01');
            }
          }
          else {
            pcVar3 = body_part(0x12);
            pline("You hurriedly regurgitate the sizzling in your %s.",pcVar3);
          }
          end_engulf(mdef);
          return 2;
        }
        otmp._0_4_ = 0;
      }
      end_engulf(mdef);
      iVar2 = mdef->mhp - (int)otmp;
      mdef->mhp = iVar2;
      if ((iVar2 < 1) && (killed(mdef), mdef->mhp < 1)) {
        return 2;
      }
      pcVar3 = "expel";
      if (((youmonst.data)->mflags1 & 0x40000) != 0) {
        pcVar3 = "regurgitate";
      }
      pcVar4 = mon_nam(mdef);
      pline("You %s %s!",pcVar3,pcVar4);
      if (((u.uprops[0x3f].intrinsic != 0) || (u.uprops[0x3f].extrinsic != 0)) ||
         (((youmonst.data)->mflags1 & 0x40000) != 0)) {
        pcVar3 = mon_nam(mdef);
        pcVar3 = s_suffix(pcVar3);
        pline("Obviously, you didn\'t like %s taste.",pcVar3);
      }
    }
  }
  return 0;
}

Assistant:

static int gulpum(struct monst *mdef, const struct attack *mattk)
{
	int tmp;
	int dam = dice((int)mattk->damn, (int)mattk->damd);
	struct obj *otmp;
	char kbuf[BUFSZ];
	/* Not totally the same as for real monsters.  Specifically, these
	 * don't take multiple moves.  (It's just too hard, for too little
	 * result, to program monsters which attack from inside you, which
	 * would be necessary if done accurately.)  Instead, we arbitrarily
	 * kill the monster immediately for AD_DGST and we regurgitate them
	 * after exactly 1 round of attack otherwise.  -KAA
	 */

	if (mdef->data->msize >= MZ_HUGE) {
	    pline("%s is too large to be engulfed.", Monnam(mdef));
	    return 0;
	}

	if (u.uhunger < 1500 && !u.uswallow) {
	    for (otmp = mdef->minvent; otmp; otmp = otmp->nobj)
		snuff_lit(otmp);

	    if (touch_petrifies(mdef->data) && !Stone_resistance) {
		pline("You bite into %s.", mon_nam(mdef));
		sprintf(kbuf, "swallowing %s whole", an(mons_mname(mdef->data)));
		delayed_petrify(NULL, kbuf);
	    } else if (touch_disintegrates(mdef->data) &&
		       !(FDisint_resistance || (PDisint_resistance && rn2(10)))) {
		pline("You bite into %s.", mon_nam(mdef));
		sprintf(kbuf, "swallowing %s whole", an(mons_mname(mdef->data)));
		instadisintegrate(kbuf);
	    } else {
		static char msgbuf[BUFSZ];
		start_engulf(mdef);
		switch(mattk->adtyp) {
		    case AD_DGST:
			/* eating a Rider or its corpse is fatal */
			if (is_rider(mdef->data)) {
			 pline("Unfortunately, digesting any of it is fatal.");
			    end_engulf(mdef);
			    sprintf(msgbuf, "unwisely tried to eat %s",
				    mons_mname(mdef->data));
			    killer = msgbuf;
			    killer_format = NO_KILLER_PREFIX;
			    done(DIED);
			    return 0;		/* lifesaved */
			}

			if (Slow_digestion) {
			    dam = 0;
			    break;
			}

			/* KMH, conduct */
			if (!vegetarian(mdef->data))
			    violated(CONDUCT_VEGETARIAN);
			else if (!vegan(mdef->data))
			    violated(CONDUCT_VEGAN);
			else
			    violated(CONDUCT_FOODLESS);

			/* Use up amulet of life saving */
			if (!!(otmp = mlifesaver(mdef))) m_useup(mdef, otmp);

			newuhs(FALSE);
			xkilled(mdef,2);
			if (mdef->mhp > 0) { /* monster lifesaved */
			    pline("You hurriedly regurgitate the sizzling in your %s.",
				body_part(STOMACH));
			} else {
			    tmp = 1 + (mdef->data->cwt >> 8);
			    if (corpse_chance(mdef, &youmonst, TRUE) &&
				!(mvitals[monsndx(mdef->data)].mvflags &
				  G_NOCORPSE)) {
				/* nutrition only if there can be a corpse */
				u.uhunger += (mdef->data->cnutrit+1) / 2;
			    } else tmp = 0;
			    sprintf(msgbuf, "You totally digest %s.",
					    mon_nam(mdef));
			    if (tmp != 0) {
				/* setting afternmv = end_engulf is tempting,
				 * but will cause problems if the player is
				 * attacked (which uses his real location) or
				 * if his See_invisible wears off
				 */
				pline("You digest %s.", mon_nam(mdef));
				if (Slow_digestion) tmp *= 2;
				nomul(-tmp, "digesting something");
				nomovemsg = msgbuf;
			    } else pline("%s", msgbuf);
			    if (mdef->data == &mons[PM_GREEN_SLIME]) {
				sprintf(msgbuf, "%s isn't sitting well with you.",
					The(mons_mname(mdef->data)));
				if (!Unchanging) {
					Slimed = 5L;
					iflags.botl = 1;
				}
			    } else
			    exercise(A_CON, TRUE);
			}
			end_engulf(mdef);
			return 2;
		    case AD_PHYS:
			if (youmonst.data == &mons[PM_FOG_CLOUD]) {
			    pline("%s is laden with your moisture.",
				  Monnam(mdef));
			    if (amphibious(mdef->data) &&
				!flaming(mdef->data)) {
				dam = 0;
				pline("%s seems unharmed.", Monnam(mdef));
			    }
			} else
			    pline("%s is pummeled with your debris!",
				  Monnam(mdef));
			break;
		    case AD_ACID:
			pline("%s is covered with your goo!", Monnam(mdef));
			if (resists_acid(mdef)) {
			    pline("It seems harmless to %s.", mon_nam(mdef));
			    dam = 0;
			}
			break;
		    case AD_BLND:
			if (can_blnd(&youmonst, mdef, mattk->aatyp, NULL)) {
			    if (mdef->mcansee)
				pline("%s can't see in there!", Monnam(mdef));
			    mdef->mcansee = 0;
			    dam += mdef->mblinded;
			    if (dam > 127) dam = 127;
			    mdef->mblinded = dam;
			}
			dam = 0;
			break;
		    case AD_ELEC:
			if (rn2(2)) {
			    pline("The air around %s crackles with electricity.", mon_nam(mdef));
			    if (resists_elec(mdef)) {
				pline("%s seems unhurt.", Monnam(mdef));
				dam = 0;
			    }
			    golemeffects(mdef,(int)mattk->adtyp,dam);
			} else dam = 0;
			break;
		    case AD_COLD:
			if (rn2(2)) {
			    if (resists_cold(mdef)) {
				pline("%s seems mildly chilly.", Monnam(mdef));
				dam = 0;
			    } else
				pline("%s is freezing to death!",Monnam(mdef));
			    golemeffects(mdef,(int)mattk->adtyp,dam);
			} else dam = 0;
			break;
		    case AD_FIRE:
			if (rn2(2)) {
			    if (resists_fire(mdef)) {
				pline("%s seems mildly hot.", Monnam(mdef));
				dam = 0;
			    } else
				pline("%s is burning to a crisp!",Monnam(mdef));
			    golemeffects(mdef,(int)mattk->adtyp,dam);
			} else dam = 0;
			break;
		}
		end_engulf(mdef);
		if ((mdef->mhp -= dam) <= 0) {
		    killed(mdef);
		    if (mdef->mhp <= 0)	/* not lifesaved */
			return 2;
		}
		pline("You %s %s!", is_animal(youmonst.data) ? "regurgitate"
			: "expel", mon_nam(mdef));
		if (Slow_digestion || is_animal(youmonst.data)) {
		    pline("Obviously, you didn't like %s taste.",
			  s_suffix(mon_nam(mdef)));
		}
	    }
	}
	return 0;
}